

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O3

void __thiscall llvm::MD5::final(MD5 *this,MD5Result *Result)

{
  uint8_t *puVar1;
  MD5_u32plus MVar2;
  MD5_u32plus MVar3;
  long lVar4;
  ulong uVar5;
  ArrayRef<unsigned_char> Data;
  ArrayRef<unsigned_char> Data_00;
  
  uVar5 = (ulong)(this->lo & 0x3f);
  puVar1 = this->buffer;
  lVar4 = uVar5 + 1;
  this->buffer[uVar5] = 0x80;
  uVar5 = uVar5 ^ 0x3f;
  if (uVar5 < 8) {
    memset(puVar1 + lVar4,0,uVar5);
    uVar5 = 0x40;
    Data.Length = 0x40;
    Data.Data = puVar1;
    body(this,Data);
    lVar4 = 0;
  }
  memset(puVar1 + lVar4,0,uVar5 - 8);
  MVar2 = this->hi;
  MVar3 = this->lo << 3;
  this->lo = MVar3;
  *(MD5_u32plus *)(this->buffer + 0x38) = MVar3;
  *(MD5_u32plus *)(this->buffer + 0x3c) = MVar2;
  Data_00.Length = 0x40;
  Data_00.Data = puVar1;
  body(this,Data_00);
  *(MD5_u32plus *)(Result->Bytes)._M_elems = this->a;
  *(MD5_u32plus *)((Result->Bytes)._M_elems + 4) = this->b;
  *(MD5_u32plus *)((Result->Bytes)._M_elems + 8) = this->c;
  *(MD5_u32plus *)((Result->Bytes)._M_elems + 0xc) = this->d;
  return;
}

Assistant:

void MD5::final(MD5Result &Result) {
  unsigned long used, free;

  used = lo & 0x3f;

  buffer[used++] = 0x80;

  free = 64 - used;

  if (free < 8) {
    memset(&buffer[used], 0, free);
    body(makeArrayRef(buffer, 64));
    used = 0;
    free = 64;
  }

  memset(&buffer[used], 0, free - 8);

  lo <<= 3;
  support::endian::write32le(&buffer[56], lo);
  support::endian::write32le(&buffer[60], hi);

  body(makeArrayRef(buffer, 64));

  support::endian::write32le(&Result[0], a);
  support::endian::write32le(&Result[4], b);
  support::endian::write32le(&Result[8], c);
  support::endian::write32le(&Result[12], d);
}